

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayops.c
# Opt level: O0

LispPTR N_OP_misc3(LispPTR baseL,LispPTR typenumber,LispPTR inx,int alpha)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  uint local_24;
  uint local_20;
  int type;
  int index;
  int alpha_local;
  LispPTR inx_local;
  LispPTR typenumber_local;
  LispPTR baseL_local;
  
  if (alpha != 9) {
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  if ((inx & 0xfff0000) == 0xe0000) {
    local_20 = inx & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (inx >> 9)) ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar2 = NativeAligned4FromLAddr(inx);
    local_20 = *pLVar2;
    if ((local_20 & 0x80000000) != 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  if ((typenumber & 0xfff0000) == 0xe0000) {
    local_24 = typenumber & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (typenumber >> 9)) ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar2 = NativeAligned4FromLAddr(typenumber);
    local_24 = *pLVar2;
    if ((local_24 & 0x80000000) != 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  LVar1 = aref_switch(local_24,inx,baseL,local_20);
  return LVar1;
}

Assistant:

LispPTR N_OP_misc3(LispPTR baseL, LispPTR typenumber, LispPTR inx, int alpha) {
  int index, type;

  if (alpha != 9) ERROR_EXIT(inx);
  /*  test and setup index  */
  N_GetPos(inx, index, inx);

  /*  test and setup typenumber  */
  N_GetPos(typenumber, type, inx);

  /*  dispatch on type  */
  return (aref_switch((unsigned)type, inx, baseL, index));
}